

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setLeaveBound4Row(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,int i,int n)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  undefined8 uVar9;
  pointer pnVar11;
  long lVar12;
  cpp_dec_float<200u,int,void> *pcVar13;
  uint *puVar14;
  uint *puVar15;
  undefined4 *puVar16;
  pointer pnVar17;
  uint *puVar18;
  long in_FS_OFFSET;
  byte bVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined5 uStack_40;
  undefined3 uStack_3b;
  int iStack_38;
  bool bStack_34;
  undefined8 local_30;
  
  bVar19 = 0;
  switch((this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thedesc.rowstat.data[n]) {
  case P_FIXED:
    ::soplex::infinity::__tls_init();
    dVar1 = *(double *)(in_FS_OFFSET + -8);
    uVar20 = SUB84(dVar1,0);
    uVar21 = (undefined4)((ulong)dVar1 >> 0x20);
    local_30 = 0x1c00000000;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uStack_3b = 0;
    iStack_38 = 0;
    bStack_34 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_a8,-dVar1);
    pnVar11 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar13 = (cpp_dec_float<200u,int,void> *)&local_a8;
    pnVar17 = pnVar11 + i;
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = *(undefined4 *)pcVar13;
      pcVar13 = pcVar13 + (ulong)bVar19 * -8 + 4;
      pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar19 * -2 + 1) * 4);
    }
    pnVar11[i].m_backend.exp = iStack_38;
    pnVar11[i].m_backend.neg = bStack_34;
    pnVar11[i].m_backend.fpclass = (undefined4)local_30;
    pnVar11[i].m_backend.prec_elem = local_30._4_4_;
    ::soplex::infinity::__tls_init();
    break;
  default:
    puVar15 = (uint *)((this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + n);
    uVar6 = *puVar15;
    puVar18 = (uint *)&local_a8;
    puVar14 = puVar15;
    for (lVar12 = 0x1b; puVar14 = puVar14 + 1, lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar14;
      puVar18 = puVar18 + 1;
    }
    uVar7 = puVar15[0x1c];
    puVar14 = (uint *)((this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i);
    uVar9 = *(undefined8 *)(puVar15 + 0x1e);
    bVar19 = *(byte *)(puVar15 + 0x1d);
    *puVar14 = uVar6;
    puVar15 = (uint *)&local_a8;
    puVar18 = puVar14;
    for (lVar12 = 0x1b; puVar18 = puVar18 + 1, lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar15;
      puVar15 = puVar15 + 1;
    }
    puVar14[0x1c] = uVar7;
    *(byte *)(puVar14 + 0x1d) = (uVar6 != 0 || (int)uVar9 != 0) ^ bVar19;
    *(undefined8 *)(puVar14 + 0x1e) = uVar9;
    pnVar11 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_00524c54;
  case P_ON_LOWER:
    ::soplex::infinity::__tls_init();
    local_30 = 0x1c00000000;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uStack_3b = 0;
    iStack_38 = 0;
    bStack_34 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_a8,-*(double *)(in_FS_OFFSET + -8));
    pnVar11 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar13 = (cpp_dec_float<200u,int,void> *)&local_a8;
    pnVar17 = pnVar11 + i;
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = *(undefined4 *)pcVar13;
      pcVar13 = pcVar13 + (ulong)bVar19 * -8 + 4;
      pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar19 * -2 + 1) * 4);
    }
    pnVar11[i].m_backend.exp = iStack_38;
    pnVar11[i].m_backend.neg = bStack_34;
    pnVar11[i].m_backend.fpclass = (undefined4)local_30;
    pnVar11[i].m_backend.prec_elem = local_30._4_4_;
    pnVar11 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + n;
    iVar4 = *(int *)&(pnVar11->m_backend).data;
    puVar14 = (uint *)((long)&(pnVar11->m_backend).data + 4);
    puVar18 = (uint *)&local_a8;
    for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar14;
      puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
      puVar18 = puVar18 + (ulong)bVar19 * -2 + 1;
    }
    iVar5 = (pnVar11->m_backend).exp;
    pnVar17 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + i;
    uVar8 = (pnVar11->m_backend).fpclass;
    uVar10 = (pnVar11->m_backend).prec_elem;
    bVar3 = (pnVar11->m_backend).neg;
    *(int *)&(pnVar17->m_backend).data = iVar4;
    puVar14 = (uint *)&local_a8;
    puVar18 = (uint *)((long)&(pnVar17->m_backend).data + 4);
    for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar14;
      puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
      puVar18 = puVar18 + (ulong)bVar19 * -2 + 1;
    }
    (pnVar17->m_backend).exp = iVar5;
    (pnVar17->m_backend).neg = (bool)((iVar4 != 0 || uVar8 != 0) ^ bVar3);
    (pnVar17->m_backend).fpclass = uVar8;
    (pnVar17->m_backend).prec_elem = uVar10;
    return;
  case P_ON_UPPER:
    puVar15 = (uint *)((this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + n);
    uVar6 = *puVar15;
    puVar18 = (uint *)&local_a8;
    puVar14 = puVar15;
    for (lVar12 = 0x1b; puVar14 = puVar14 + 1, lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar14;
      puVar18 = puVar18 + 1;
    }
    uVar7 = puVar15[0x1c];
    puVar14 = (uint *)((this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i);
    uVar9 = *(undefined8 *)(puVar15 + 0x1e);
    bVar2 = *(byte *)(puVar15 + 0x1d);
    *puVar14 = uVar6;
    puVar15 = (uint *)&local_a8;
    puVar18 = puVar14;
    for (lVar12 = 0x1b; puVar18 = puVar18 + 1, lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar15;
      puVar15 = puVar15 + 1;
    }
    puVar14[0x1c] = uVar7;
    *(byte *)(puVar14 + 0x1d) = (uVar6 != 0 || (int)uVar9 != 0) ^ bVar2;
    *(undefined8 *)(puVar14 + 0x1e) = uVar9;
    ::soplex::infinity::__tls_init();
    uVar20 = (undefined4)*(undefined8 *)(in_FS_OFFSET + -8);
    uVar21 = (undefined4)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20);
    break;
  case P_FREE:
    puVar15 = (uint *)((this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + n);
    uVar6 = *puVar15;
    puVar18 = (uint *)&local_a8;
    puVar14 = puVar15;
    for (lVar12 = 0x1b; puVar14 = puVar14 + 1, lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar14;
      puVar18 = puVar18 + 1;
    }
    uVar7 = puVar15[0x1c];
    puVar14 = (uint *)((this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i);
    uVar9 = *(undefined8 *)(puVar15 + 0x1e);
    bVar19 = *(byte *)(puVar15 + 0x1d);
    *puVar14 = uVar6;
    puVar15 = (uint *)&local_a8;
    puVar18 = puVar14;
    for (lVar12 = 0x1b; puVar18 = puVar18 + 1, lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar15;
      puVar15 = puVar15 + 1;
    }
    puVar14[0x1c] = uVar7;
    *(byte *)(puVar14 + 0x1d) = (uVar6 != 0 || (int)uVar9 != 0) ^ bVar19;
    *(undefined8 *)(puVar14 + 0x1e) = uVar9;
    pnVar11 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
LAB_00524c54:
    puVar15 = (uint *)(pnVar11 + n);
    uVar6 = *puVar15;
    puVar18 = (uint *)&local_a8;
    puVar14 = puVar15;
    for (lVar12 = 0x1b; puVar14 = puVar14 + 1, lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar14;
      puVar18 = puVar18 + 1;
    }
    uVar7 = puVar15[0x1c];
    puVar14 = (uint *)((this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i);
    uVar9 = *(undefined8 *)(puVar15 + 0x1e);
    bVar19 = *(byte *)(puVar15 + 0x1d);
    *puVar14 = uVar6;
    puVar15 = (uint *)&local_a8;
    puVar18 = puVar14;
    for (lVar12 = 0x1b; puVar18 = puVar18 + 1, lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar15;
      puVar15 = puVar15 + 1;
    }
    puVar14[0x1c] = uVar7;
    *(byte *)(puVar14 + 0x1d) = (uVar6 != 0 || (int)uVar9 != 0) ^ bVar19;
    *(undefined8 *)(puVar14 + 0x1e) = uVar9;
    return;
  }
  local_30 = 0x1c00000000;
  bStack_34 = false;
  iStack_38 = 0;
  uStack_3b = 0;
  uStack_40 = 0;
  local_48 = 0;
  uStack_50 = 0;
  local_58 = 0;
  uStack_60 = 0;
  local_68 = 0;
  uStack_70 = 0;
  local_78 = 0;
  uStack_80 = 0;
  local_88 = 0;
  uStack_90 = 0;
  local_98 = 0;
  uStack_a0 = 0;
  local_a8 = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_a8,(double)CONCAT44(uVar21,uVar20));
  pnVar11 = (this->theUBbound).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar13 = (cpp_dec_float<200u,int,void> *)&local_a8;
  puVar16 = (undefined4 *)(pnVar11 + i);
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar16 = *(undefined4 *)pcVar13;
    pcVar13 = pcVar13 + (ulong)bVar19 * -8 + 4;
    puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
  }
  *(int *)((long)(pnVar11 + i) + 0x70) = iStack_38;
  *(bool *)((long)(pnVar11 + i) + 0x74) = bStack_34;
  *(undefined8 *)((long)(pnVar11 + i) + 0x78) = local_30;
  return;
}

Assistant:

void SPxSolverBase<R>::setLeaveBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FREE :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   default:
      assert(rep() == COLUMN);
      theLBbound[i] = -this->rhs(n);                // slacks !
      theUBbound[i] = -this->lhs(n);                // slacks !
      break;
   }
}